

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_ec30ed::AV1FwdTxfm2d::SetUp(AV1FwdTxfm2d *this)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<unsigned_char,_unsigned_char,_double,_double>_> *p_Var2;
  __tuple_element_t<1UL,_tuple<unsigned_char,_unsigned_char,_double,_double>_> *p_Var3;
  __tuple_element_t<2UL,_tuple<unsigned_char,_unsigned_char,_double,_double>_> *p_Var4;
  __tuple_element_t<3UL,_tuple<unsigned_char,_unsigned_char,_double,_double>_> *p_Var5;
  void *pvVar6;
  char *pcVar7;
  long in_RDI;
  double dVar8;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TXFM_2D_FLIP_CFG fwd_txfm_flip_cfg;
  AssertHelper *in_stack_fffffffffffffea0;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  AssertionResult *this_01;
  int line;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  undefined1 uVar9;
  undefined8 in_stack_fffffffffffffec8;
  Type type;
  AssertHelper *in_stack_fffffffffffffed0;
  AssertionResult *this_02;
  TX_SIZE in_stack_ffffffffffffff06;
  TX_TYPE in_stack_ffffffffffffff07;
  Message *in_stack_ffffffffffffff18;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff20;
  AssertionResult local_c0 [2];
  undefined8 local_a0;
  AssertionResult local_98;
  uint local_84;
  undefined8 local_60;
  AssertionResult local_58;
  byte local_48;
  undefined4 local_44;
  undefined4 local_40;
  
  type = (Type)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  testing::WithParamInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::GetParam()
  ;
  p_Var2 = std::get<0ul,unsigned_char,unsigned_char,double,double>
                     ((tuple<unsigned_char,_unsigned_char,_double,_double> *)0x9c1df9);
  *(__tuple_element_t<0UL,_tuple<unsigned_char,_unsigned_char,_double,_double>_> *)(in_RDI + 0x38) =
       *p_Var2;
  testing::WithParamInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::GetParam()
  ;
  p_Var3 = std::get<1ul,unsigned_char,unsigned_char,double,double>
                     ((tuple<unsigned_char,_unsigned_char,_double,_double> *)0x9c1e13);
  *(__tuple_element_t<1UL,_tuple<unsigned_char,_unsigned_char,_double,_double>_> *)(in_RDI + 0x39) =
       *p_Var3;
  testing::WithParamInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::GetParam()
  ;
  p_Var4 = std::get<2ul,unsigned_char,unsigned_char,double,double>
                     ((tuple<unsigned_char,_unsigned_char,_double,_double> *)0x9c1e2d);
  *(__tuple_element_t<2UL,_tuple<unsigned_char,_unsigned_char,_double,_double>_> *)(in_RDI + 0x18) =
       *p_Var4;
  testing::WithParamInterface<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::GetParam()
  ;
  p_Var5 = std::get<3ul,unsigned_char,unsigned_char,double,double>
                     ((tuple<unsigned_char,_unsigned_char,_double,_double> *)0x9c1e4b);
  *(__tuple_element_t<3UL,_tuple<unsigned_char,_unsigned_char,_double,_double>_> *)(in_RDI + 0x20) =
       *p_Var5;
  *(undefined4 *)(in_RDI + 0x28) = 500;
  av1_get_fwd_txfm_cfg
            ((TX_TYPE)((ulong)in_stack_fffffffffffffeb0 >> 0x38),
             (TX_SIZE)((ulong)in_stack_fffffffffffffeb0 >> 0x30),
             (TXFM_2D_FLIP_CFG *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  dVar8 = libaom_test::get_amplification_factor(in_stack_ffffffffffffff07,in_stack_ffffffffffffff06)
  ;
  *(double *)(in_RDI + 0x30) = dVar8;
  *(int *)(in_RDI + 0x3c) = ::tx_size_wide[local_48];
  *(int *)(in_RDI + 0x40) = ::tx_size_high[local_48];
  *(undefined4 *)(in_RDI + 0x70) = local_44;
  *(undefined4 *)(in_RDI + 0x74) = local_40;
  *(undefined8 *)(in_RDI + 0x48) =
       *(undefined8 *)(libaom_test::fwd_txfm_func_ls + (ulong)*(byte *)(in_RDI + 0x39) * 8);
  *(int *)(in_RDI + 0x44) = *(int *)(in_RDI + 0x3c) * *(int *)(in_RDI + 0x40);
  pvVar6 = aom_memalign((size_t)in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
  *(void **)(in_RDI + 0x50) = pvVar6;
  local_60 = 0;
  testing::internal::CmpHelperNE<short*,decltype(nullptr)>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             (short **)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
             &in_stack_fffffffffffffea0->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffed0);
    testing::AssertionResult::failure_message((AssertionResult *)0x9c1fa3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffed0,type,
               (char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff20._M_head_impl,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0x9c2000);
  }
  local_84 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x9c206e);
  if (local_84 == 0) {
    pvVar6 = aom_memalign((size_t)in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
    *(void **)(in_RDI + 0x58) = pvVar6;
    local_a0 = 0;
    this_02 = &local_98;
    testing::internal::CmpHelperNE<int*,decltype(nullptr)>
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               (int **)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
               &in_stack_fffffffffffffea0->data_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
    if (!bVar1) {
      testing::Message::Message((Message *)this_02);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x9c2144);
      type = (Type)((ulong)pcVar7 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_02,type,
                 (char *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                 (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffff20._M_head_impl,in_stack_ffffffffffffff18);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffea0);
      testing::Message::~Message((Message *)0x9c21a1);
    }
    local_84 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x9c220f);
    if (local_84 == 0) {
      pvVar6 = aom_memalign((size_t)in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
      *(void **)(in_RDI + 0x60) = pvVar6;
      this_01 = local_c0;
      testing::internal::CmpHelperNE<double*,decltype(nullptr)>
                (&this_01->success_,in_stack_fffffffffffffeb0,
                 (double **)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                 &in_stack_fffffffffffffea0->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
      uVar9 = bVar1;
      if (!bVar1) {
        testing::Message::Message((Message *)this_02);
        in_stack_fffffffffffffeb0 =
             testing::AssertionResult::failure_message((AssertionResult *)0x9c22e5);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_02,type,(char *)CONCAT17(uVar9,in_stack_fffffffffffffec0),
                   (int)((ulong)this_01 >> 0x20),in_stack_fffffffffffffeb0);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_ffffffffffffff20._M_head_impl,in_stack_ffffffffffffff18)
        ;
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffea0);
        testing::Message::~Message((Message *)0x9c2342);
      }
      local_84 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x9c23b0);
      if (local_84 == 0) {
        pvVar6 = aom_memalign((size_t)this_01,(size_t)in_stack_fffffffffffffeb0);
        *(void **)(in_RDI + 0x68) = pvVar6;
        this_00 = (AssertionResult *)&stack0xffffffffffffff18;
        testing::internal::CmpHelperNE<double*,decltype(nullptr)>
                  (&this_01->success_,in_stack_fffffffffffffeb0,
                   (double **)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                   (void **)this_00);
        line = (int)((ulong)this_01 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
        if (!bVar1) {
          testing::Message::Message((Message *)this_02);
          testing::AssertionResult::failure_message((AssertionResult *)0x9c247d);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_02,type,(char *)CONCAT17(uVar9,in_stack_fffffffffffffec0),
                     line,in_stack_fffffffffffffeb0);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)in_stack_ffffffffffffff20._M_head_impl,
                     in_stack_ffffffffffffff18);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          testing::Message::~Message((Message *)0x9c24c9);
        }
        local_84 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x9c252e);
      }
    }
  }
  return;
}

Assistant:

void SetUp() override {
    tx_type_ = GET_PARAM(0);
    tx_size_ = GET_PARAM(1);
    max_error_ = GET_PARAM(2);
    max_avg_error_ = GET_PARAM(3);
    count_ = 500;
    TXFM_2D_FLIP_CFG fwd_txfm_flip_cfg;
    av1_get_fwd_txfm_cfg(tx_type_, tx_size_, &fwd_txfm_flip_cfg);
    amplify_factor_ = libaom_test::get_amplification_factor(tx_type_, tx_size_);
    tx_width_ = tx_size_wide[fwd_txfm_flip_cfg.tx_size];
    tx_height_ = tx_size_high[fwd_txfm_flip_cfg.tx_size];
    ud_flip_ = fwd_txfm_flip_cfg.ud_flip;
    lr_flip_ = fwd_txfm_flip_cfg.lr_flip;

    fwd_txfm_ = libaom_test::fwd_txfm_func_ls[tx_size_];
    txfm2d_size_ = tx_width_ * tx_height_;
    input_ = reinterpret_cast<int16_t *>(
        aom_memalign(16, sizeof(input_[0]) * txfm2d_size_));
    ASSERT_NE(input_, nullptr);
    output_ = reinterpret_cast<int32_t *>(
        aom_memalign(16, sizeof(output_[0]) * txfm2d_size_));
    ASSERT_NE(output_, nullptr);
    ref_input_ = reinterpret_cast<double *>(
        aom_memalign(16, sizeof(ref_input_[0]) * txfm2d_size_));
    ASSERT_NE(ref_input_, nullptr);
    ref_output_ = reinterpret_cast<double *>(
        aom_memalign(16, sizeof(ref_output_[0]) * txfm2d_size_));
    ASSERT_NE(ref_output_, nullptr);
  }